

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istreamwrapper.h
# Opt level: O0

void __thiscall
rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read
          (BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *this)

{
  long *plVar1;
  ulong uVar2;
  undefined8 uVar3;
  undefined8 *in_RDI;
  
  if ((ulong)in_RDI[5] < (ulong)in_RDI[4]) {
    in_RDI[5] = in_RDI[5] + 1;
  }
  else if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    in_RDI[7] = in_RDI[6] + in_RDI[7];
    in_RDI[6] = in_RDI[3];
    in_RDI[4] = in_RDI[2] + in_RDI[6] + -1;
    in_RDI[5] = in_RDI[2];
    plVar1 = (long *)std::istream::read((char *)*in_RDI,in_RDI[2]);
    uVar2 = std::ios::operator!((ios *)((long)plVar1 + *(long *)(*plVar1 + -0x18)));
    if ((uVar2 & 1) != 0) {
      uVar3 = std::istream::gcount();
      in_RDI[6] = uVar3;
      in_RDI[4] = in_RDI[2] + in_RDI[6];
      *(undefined1 *)(in_RDI[2] + in_RDI[6]) = 0;
      *(undefined1 *)(in_RDI + 8) = 1;
    }
  }
  return;
}

Assistant:

void Read() {
        if (current_ < bufferLast_)
            ++current_;
        else if (!eof_) {
            count_ += readCount_;
            readCount_ = bufferSize_;
            bufferLast_ = buffer_ + readCount_ - 1;
            current_ = buffer_;

            if (!stream_.read(buffer_, static_cast<std::streamsize>(bufferSize_))) {
                readCount_ = static_cast<size_t>(stream_.gcount());
                *(bufferLast_ = buffer_ + readCount_) = '\0';
                eof_ = true;
            }
        }
    }